

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l10n.c
# Opt level: O3

int read_token(char *buffer,char *token,size_t len)

{
  ulong uVar1;
  ushort **ppuVar2;
  char cVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  
  bVar9 = *buffer == '{';
  cVar3 = buffer[bVar9];
  if (cVar3 == '\0') {
    iVar5 = (uint)bVar9 + (int)buffer;
  }
  else {
    uVar4 = 0;
    pcVar7 = buffer + bVar9;
    do {
      pcVar6 = pcVar7 + 1;
      pcVar8 = pcVar6;
      if ((cVar3 == '}') ||
         (ppuVar2 = __ctype_b_loc(), pcVar8 = pcVar7, ((*ppuVar2)[cVar3] & 8) == 0)) {
        iVar5 = (int)pcVar8;
        token = token + uVar4;
        goto LAB_0010708c;
      }
      uVar1 = uVar4 + 1;
      token[uVar4] = cVar3;
      cVar3 = *pcVar6;
    } while ((cVar3 != '\0') && (bVar9 = uVar4 < 0xf, uVar4 = uVar1, pcVar7 = pcVar6, bVar9));
    token = token + uVar1;
    iVar5 = (int)pcVar6;
  }
LAB_0010708c:
  *token = '\0';
  return iVar5 - (int)buffer;
}

Assistant:

static int read_token(const char *buffer, char *token, size_t len)
{
    char *po = token;
    const char *pi = buffer;
    if (*pi == '{') ++pi;
    while (*pi && po < token + len) {
        if (*pi == '}') {
            ++pi;
            break;
        }
        if (!isalnum(*pi)) {
            break;
        }
        *po++ = *pi++;
    }
    *po = '\0';
    return (int)(pi - buffer);
}